

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

GLuint __thiscall
deqp::gles3::Functional::anon_unknown_0::SamplerBinder::getBinding(SamplerBinder *this)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  ContextWrapper *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  MessageBuilder local_218;
  GLuint aGStack_98 [2];
  GLint arr [32];
  SamplerBinder *this_local;
  
  arr[0x1a] = 0;
  arr[0x1b] = 0;
  arr[0x1c] = 0;
  arr[0x1d] = 0;
  arr[0x16] = 0;
  arr[0x17] = 0;
  arr[0x18] = 0;
  arr[0x19] = 0;
  arr[0x12] = 0;
  arr[0x13] = 0;
  arr[0x14] = 0;
  arr[0x15] = 0;
  arr[0xe] = 0;
  arr[0xf] = 0;
  arr[0x10] = 0;
  arr[0x11] = 0;
  arr[10] = 0;
  arr[0xb] = 0;
  arr[0xc] = 0;
  arr[0xd] = 0;
  arr[6] = 0;
  arr[7] = 0;
  arr[8] = 0;
  arr[9] = 0;
  arr[2] = 0;
  arr[3] = 0;
  arr[4] = 0;
  arr[5] = 0;
  aGStack_98[0] = 0;
  aGStack_98[1] = 0;
  arr[0] = 0;
  arr[1] = 0;
  this_01 = &(this->super_Binder).super_ContextWrapper;
  glu::CallLogWrapper::glGetIntegerv(&this_01->super_CallLogWrapper,0x8919,(GLint *)aGStack_98);
  deqp::gls::LifetimeTests::details::ContextWrapper::log
            (this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  tcu::TestLog::operator<<(&local_218,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_218,(char (*) [26])"// First output integer: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)aGStack_98);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_218);
  return aGStack_98[0];
}

Assistant:

GLuint				getBinding		(void)
	{
		GLint arr[32] = {};
		glGetIntegerv(GL_SAMPLER_BINDING, arr);
		log() << TestLog::Message << "// First output integer: " << arr[0]
			  << TestLog::EndMessage;
		return arr[0];
	}